

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O3

char * transform_iffeat_schema2json(lys_module *module,char *expr)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *__ptr;
  byte *id;
  ulong uVar4;
  lys_module *plVar5;
  size_t sVar6;
  LY_ERR *pLVar7;
  long lVar8;
  ulong uVar9;
  size_t local_40;
  
  local_40 = strlen(expr);
  local_40 = local_40 + 1;
  pcVar2 = (char *)malloc(local_40);
  if (pcVar2 == (char *)0x0) {
LAB_0010f61d:
    pLVar7 = &ly_err_location()->no;
    if ((ly_err *)pLVar7 == (ly_err *)0x0) {
      pLVar7 = &ly_errno_int;
    }
    ((ly_err *)pLVar7)->no = LY_EMEM;
    ly_log(LY_LLERR,"Memory allocation failed (%s()).","transform_iffeat_schema2json");
    return (char *)0x0;
  }
  pcVar3 = strchr(expr,0x3a);
  if (pcVar3 == (char *)0x0) {
    lVar8 = 0;
  }
  else {
    lVar8 = 0;
    __ptr = pcVar2;
    do {
      id = (byte *)strpbrk_backwards(pcVar3 + -1,"/ [\'\"",~(uint)expr + (int)pcVar3);
      if ((*id - 0x20 < 0x3c) && ((0x800000000008085U >> ((ulong)(*id - 0x20) & 0x3f) & 1) != 0)) {
        id = id + 1;
      }
      uVar9 = (long)pcVar3 - (long)id;
      iVar1 = parse_identifier((char *)id);
      uVar4 = (ulong)iVar1;
      if (uVar4 < uVar9) {
        ly_vlog(LYE_INCHAR,LY_VLOG_NONE,(void *)0x0,(ulong)(uint)(int)(char)id[uVar4],id + uVar4);
LAB_0010f60a:
        free(__ptr);
        return (char *)0x0;
      }
      plVar5 = lys_get_import_module(module,(char *)id,(int)uVar9,(char *)0x0,0);
      if (plVar5 == (lys_module *)0x0) {
        ly_vlog(LYE_INMOD_LEN,LY_VLOG_NONE,(void *)0x0,uVar9,id);
        goto LAB_0010f60a;
      }
      sVar6 = strlen(plVar5->name);
      local_40 = local_40 + (sVar6 - uVar9);
      pcVar2 = (char *)realloc(__ptr,local_40);
      if (pcVar2 == (char *)0x0) {
        free(__ptr);
        goto LAB_0010f61d;
      }
      strncpy(pcVar2 + lVar8,expr,(long)id - (long)expr);
      lVar8 = ((long)id - (long)expr) + lVar8;
      strcpy(pcVar2 + lVar8,plVar5->name);
      sVar6 = strlen(plVar5->name);
      pcVar2[sVar6 + lVar8] = ':';
      lVar8 = sVar6 + lVar8 + 1;
      expr = pcVar3 + 1;
      pcVar3 = strchr(expr,0x3a);
      __ptr = pcVar2;
    } while (pcVar3 != (char *)0x0);
  }
  strcpy(pcVar2 + lVar8,expr);
  sVar6 = strlen(expr);
  if (local_40 == sVar6 + lVar8 + 1) {
    pcVar2 = lydict_insert_zc(module->ctx,pcVar2);
    return pcVar2;
  }
  __assert_fail("out_size == out_used",
                "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/common.c"
                ,0x330,
                "const char *transform_iffeat_schema2json(const struct lys_module *, const char *)")
  ;
}

Assistant:

const char *
transform_iffeat_schema2json(const struct lys_module *module, const char *expr)
{
    const char *in, *id;
    char *out, *col;
    size_t out_size, out_used, id_len, rc;
    const struct lys_module *mod;

    in = expr;
    out_size = strlen(in) + 1;
    out = malloc(out_size);
    if (!out) {
        LOGMEM;
        return NULL;
    }
    out_used = 0;

    while (1) {
        col = strchr(in, ':');
        /* we're finished, copy the remaining part */
        if (!col) {
            strcpy(&out[out_used], in);
            out_used += strlen(in) + 1;
            assert(out_size == out_used);
            return lydict_insert_zc(module->ctx, out);
        }
        id = strpbrk_backwards(col - 1, "/ [\'\"", (col - in) - 1);
        if ((id[0] == '/') || (id[0] == ' ') || (id[0] == '[') || (id[0] == '\'') || (id[0] == '\"')) {
            ++id;
        }
        id_len = col - id;
        rc = parse_identifier(id);
        if (rc < id_len) {
            LOGVAL(LYE_INCHAR, LY_VLOG_NONE, NULL, id[rc], &id[rc]);
            free(out);
            return NULL;
        }

        /* get the module */
        mod = lys_get_import_module(module, id, id_len, NULL, 0);
        if (!mod) {
            LOGVAL(LYE_INMOD_LEN, LY_VLOG_NONE, NULL, id_len, id);
            free(out);
            return NULL;
        }

        /* adjust out size (it can even decrease in some strange cases) */
        out_size += strlen(mod->name) - id_len;
        out = ly_realloc(out, out_size);
        if (!out) {
            LOGMEM;
            return NULL;
        }

        /* copy the data before prefix */
        strncpy(&out[out_used], in, id - in);
        out_used += id - in;

        /* copy the model name */
        strcpy(&out[out_used], mod->name);
        out_used += strlen(mod->name);

        /* copy ':' */
        out[out_used] = ':';
        ++out_used;

        /* finally adjust in pointer for next round */
        in = col + 1;
    }

    /* unreachable */
    LOGINT;
    return NULL;
}